

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  int *piVar2;
  lua_CFunction p_Var3;
  TValue *obj;
  ushort uVar4;
  size_t sVar5;
  char *pcVar6;
  
  obj = index2addr(L,idx);
  uVar4 = obj->tt_ & 0xf;
  if (uVar4 == 3) {
    iVar1 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar1 + 1;
    if (iVar1 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x19a,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
    luaO_tostring(L,obj);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    obj = index2addr(L,idx);
    piVar2 = *(int **)&L[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x19e,"const char *lua_tolstring(lua_State *, int, size_t *)");
    }
  }
  else if (uVar4 != 4) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    return (char *)0x0;
  }
  uVar4 = obj->tt_;
  if (len == (size_t *)0x0) {
LAB_0010b8b5:
    if ((uVar4 & 0xf) == 4) {
      if ((((obj->value_).gc)->tt & 0xf) == 4) {
        return (char *)&(obj->value_).gc[1].tt;
      }
      pcVar6 = "(((((o)->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      pcVar6 = "(((((((o))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x1a2,"const char *lua_tolstring(lua_State *, int, size_t *)");
  }
  if ((uVar4 & 0xf) == 4) {
    p_Var3 = (obj->value_).f;
    if (((byte)p_Var3[8] & 0xf) == 4) {
      if (p_Var3[8] == (_func_int_lua_State_ptr)0x4) {
        sVar5 = (size_t)(byte)p_Var3[0xb];
      }
      else {
        sVar5 = *(size_t *)(p_Var3 + 0x10);
      }
      *len = sVar5;
      goto LAB_0010b8b5;
    }
    pcVar6 = "(((((o)->value_).gc)->tt) & 0x0F) == 4";
  }
  else {
    pcVar6 = "(((((((o))->tt_)) & 0x0F)) == (4))";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x1a1,"const char *lua_tolstring(lua_State *, int, size_t *)");
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  StkId o = index2addr(L, idx);
  if (!ttisstring(o)) {
    if (!cvt2str(o)) {  /* not convertible? */
      if (len != NULL) *len = 0;
      return NULL;
    }
    lua_lock(L);  /* 'luaO_tostring' may create a new string */
    luaO_tostring(L, o);
    luaC_checkGC(L);
    o = index2addr(L, idx);  /* previous call may reallocate the stack */
    lua_unlock(L);
  }
  if (len != NULL)
    *len = vslen(o);
  return svalue(o);
}